

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O0

void __thiscall Net::Zip(Net *this,string *FileName)

{
  byte bVar1;
  reference this_00;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ostream local_218 [8];
  ofstream out;
  string *FileName_local;
  Net *this_local;
  
  std::ofstream::ofstream(local_218,(string *)FileName,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(&local_268,"File ",FileName);
    std::operator+(&local_248,&local_268," can\'t be written to\n");
    std::operator<<((ostream *)&std::cerr,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    exit(1);
  }
  net_serializer<int,_void>::serialize(local_218,this->function_type);
  this_00 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](&this->mesh,0);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
  net_serializer<int,_void>::serialize(local_218,(int)sVar2);
  net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
  ::serialize(local_218,&this->biases);
  net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
  ::serialize(local_218,&this->weights);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Net::Zip(const std::string& FileName){
    std::ofstream out(FileName, std::ios::binary);
    if (!out.is_open()){
        std::cerr << "File "+FileName+" can't be written to\n";
        exit(EXIT_FAILURE);
    }
    net_serializer<int>::serialize(out, (int)function_type);
    net_serializer<int>::serialize(out, (int)mesh[0].size());
    net_serializer<decltype(biases)>::serialize(out, biases);
    net_serializer<decltype(weights)>::serialize(out, weights);
}